

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.cpp
# Opt level: O1

bufsize_t __thiscall
SectionHdrWrapper::getContentSize(SectionHdrWrapper *this,addr_type aType,bool recalculate)

{
  bufsize_t bVar1;
  long lVar2;
  
  bVar1 = 0;
  if ((this->header != (IMAGE_SECTION_HEADER *)0x0) &&
     ((this->super_PENodeWrapper).m_PE != (PEFile *)0x0)) {
    if (recalculate) {
      if (aType == RAW) {
        bVar1 = getMappedRawSize(this);
      }
      else {
        bVar1 = 0;
      }
      if ((aType & ~RAW) == RVA) {
        bVar1 = getMappedVirtualSize(this);
        return bVar1;
      }
    }
    else {
      lVar2 = 0x10;
      if ((aType == RAW) || (lVar2 = 8, (aType & ~RAW) == RVA)) {
        bVar1 = (bufsize_t)*(uint *)(this->header->Name + lVar2);
      }
      else {
        bVar1 = 0;
      }
    }
  }
  return bVar1;
}

Assistant:

bufsize_t SectionHdrWrapper::getContentSize(Executable::addr_type aType, bool recalculate)
{
    if (!this->header || !m_PE) return 0;

    bufsize_t size = 0;
    if (!recalculate) {
        size = getContentDeclaredSize(aType);
        //printf("Declared size = %llx\n---\n", size);
        return size;
    }
    //---
    if (aType == Executable::RAW) {
        //printf ("R: ");
        size = getMappedRawSize();
    }
    if (aType == Executable::RVA || aType == Executable::VA) {
        size = getMappedVirtualSize();
        //printf ("V: ");
    }
    //printf("Mapped size = %llx\n", size);
    return size;
}